

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O0

int secp256k1_ecdsa_adaptor_sig_deserialize
              (secp256k1_ge *r,secp256k1_scalar *sigr,secp256k1_scalar *sp,uchar *adaptor_sig65)

{
  int iVar1;
  int local_38;
  int local_34;
  int overflow_1;
  int overflow;
  uchar *adaptor_sig65_local;
  secp256k1_scalar *sp_local;
  secp256k1_scalar *sigr_local;
  secp256k1_ge *r_local;
  
  _overflow_1 = adaptor_sig65;
  adaptor_sig65_local = (uchar *)sp;
  sp_local = sigr;
  sigr_local = (secp256k1_scalar *)r;
  if ((r == (secp256k1_ge *)0x0) ||
     (iVar1 = secp256k1_dleq_deserialize_point(r,adaptor_sig65), iVar1 != 0)) {
    if ((sp_local == (secp256k1_scalar *)0x0) ||
       (secp256k1_scalar_set_b32(sp_local,_overflow_1 + 1,&local_34), local_34 == 0)) {
      if ((adaptor_sig65_local == (uchar *)0x0) ||
         (secp256k1_scalar_set_b32
                    ((secp256k1_scalar *)adaptor_sig65_local,_overflow_1 + 0x21,&local_38),
         local_38 == 0)) {
        r_local._4_4_ = 1;
      }
      else {
        r_local._4_4_ = 0;
      }
    }
    else {
      r_local._4_4_ = 0;
    }
  }
  else {
    r_local._4_4_ = 0;
  }
  return r_local._4_4_;
}

Assistant:

static int secp256k1_ecdsa_adaptor_sig_deserialize(secp256k1_ge *r, secp256k1_scalar *sigr, secp256k1_scalar *sp, const unsigned char *adaptor_sig65) {
    /* Ensure that whenever you call this function to deserialize r you also
     * check that X fits into a sigr */
    VERIFY_CHECK((r == NULL) || (r != NULL && sigr != NULL));
    if (r != NULL) {
        if (!secp256k1_dleq_deserialize_point(r, &adaptor_sig65[0])) {
            return 0;
        }
    }
    if (sigr != NULL) {
        int overflow;
        secp256k1_scalar_set_b32(sigr, &adaptor_sig65[1], &overflow);
        if(overflow) {
            return 0;
        }
    }
    if (sp != NULL) {
        int overflow;
        secp256k1_scalar_set_b32(sp, &adaptor_sig65[33], &overflow);
        if(overflow) {
            return 0;
        }
    }
    return 1;
}